

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXDocument.cpp
# Opt level: O2

Object * __thiscall Assimp::FBX::LazyObject::Get(LazyObject *this,bool dieOnError)

{
  Object *pOVar1;
  Element *pEVar2;
  char *__s1;
  int iVar3;
  pointer ppTVar4;
  Cluster *this_00;
  MeshGeometry *this_01;
  ShapeGeometry *this_02;
  char **err_out;
  Token *err_out_00;
  Token *pTVar5;
  Token *pTVar6;
  size_t __n;
  string name;
  string classtag;
  char *err;
  Token *local_a0;
  LazyObject *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((this->flags & 3) != 0) {
    return (Object *)0x0;
  }
  pOVar1 = (this->object)._M_t.
           super___uniq_ptr_impl<const_Assimp::FBX::Object,_std::default_delete<const_Assimp::FBX::Object>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_Assimp::FBX::Object_*,_std::default_delete<const_Assimp::FBX::Object>_>
           .super__Head_base<0UL,_const_Assimp::FBX::Object_*,_false>._M_head_impl;
  if (pOVar1 != (Object *)0x0) {
    return pOVar1;
  }
  pEVar2 = this->element;
  ppTVar4 = (pEVar2->tokens).
            super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  err_out = (char **)((long)(pEVar2->tokens).
                            super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar4);
  if (err_out < (char **)0x11) {
    std::__cxx11::string::string
              ((string *)&name,"expected at least 3 tokens: id, name and class tag",
               (allocator *)&classtag);
    Util::DOMError(&name,this->element);
  }
  pTVar6 = pEVar2->key_token;
  ParseTokenAsString_abi_cxx11_(&name,(FBX *)ppTVar4[1],(Token *)&err,err_out);
  if (err != (char *)0x0) {
    std::__cxx11::string::string((string *)&classtag,err,(allocator *)&local_90);
    Util::DOMError(&classtag,this->element);
  }
  ppTVar4 = (pEVar2->tokens).
            super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  err_out_00 = ppTVar4[1];
  if (err_out_00->column == 0xffffffff) {
    local_a0 = pTVar6;
    local_98 = this;
    for (pTVar5 = (Token *)0x0; pTVar5 < name._M_string_length;
        pTVar5 = (Token *)((long)&pTVar5->sbegin + 1)) {
      if ((name._M_dataplus._M_p[(long)pTVar5] == '\0') &&
         ((name._M_dataplus._M_p + 1)[(long)pTVar5] == '\x01')) {
        std::__cxx11::string::substr((ulong)&local_70,(ulong)&name);
        std::operator+(&local_90,&local_70,"::");
        err_out_00 = pTVar5;
        std::__cxx11::string::substr((ulong)&local_50,(ulong)&name);
        std::operator+(&classtag,&local_90,&local_50);
        std::__cxx11::string::operator=((string *)&name,(string *)&classtag);
        std::__cxx11::string::~string((string *)&classtag);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_70);
      }
    }
    ppTVar4 = (pEVar2->tokens).
              super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    this = local_98;
    pTVar6 = local_a0;
  }
  ParseTokenAsString_abi_cxx11_(&classtag,(FBX *)ppTVar4[2],(Token *)&err,&err_out_00->sbegin);
  if (err != (char *)0x0) {
    std::__cxx11::string::string((string *)&local_90,err,(allocator *)&local_70);
    Util::DOMError(&local_90,this->element);
  }
  *(byte *)&this->flags = (byte)this->flags | 1;
  __s1 = pTVar6->sbegin;
  __n = (long)pTVar6->send - (long)__s1;
  iVar3 = strncmp(__s1,"Geometry",__n);
  if (iVar3 == 0) {
    iVar3 = strcmp(classtag._M_dataplus._M_p,"Mesh");
    if (iVar3 == 0) {
      this_01 = (MeshGeometry *)operator_new(0x3c8);
      MeshGeometry::MeshGeometry(this_01,this->id,this->element,&name,this->doc);
      pOVar1 = (this->object)._M_t.
               super___uniq_ptr_impl<const_Assimp::FBX::Object,_std::default_delete<const_Assimp::FBX::Object>_>
               ._M_t.
               super__Tuple_impl<0UL,_const_Assimp::FBX::Object_*,_std::default_delete<const_Assimp::FBX::Object>_>
               .super__Head_base<0UL,_const_Assimp::FBX::Object_*,_false>._M_head_impl;
      (this->object)._M_t.
      super___uniq_ptr_impl<const_Assimp::FBX::Object,_std::default_delete<const_Assimp::FBX::Object>_>
      ._M_t.
      super__Tuple_impl<0UL,_const_Assimp::FBX::Object_*,_std::default_delete<const_Assimp::FBX::Object>_>
      .super__Head_base<0UL,_const_Assimp::FBX::Object_*,_false>._M_head_impl = (Object *)this_01;
      if (pOVar1 != (Object *)0x0) {
        (*pOVar1->_vptr_Object[1])();
      }
    }
    iVar3 = strcmp(classtag._M_dataplus._M_p,"Shape");
    if (iVar3 == 0) {
      this_02 = (ShapeGeometry *)operator_new(0xa0);
      ShapeGeometry::ShapeGeometry(this_02,this->id,this->element,&name,this->doc);
      pOVar1 = (this->object)._M_t.
               super___uniq_ptr_impl<const_Assimp::FBX::Object,_std::default_delete<const_Assimp::FBX::Object>_>
               ._M_t.
               super__Tuple_impl<0UL,_const_Assimp::FBX::Object_*,_std::default_delete<const_Assimp::FBX::Object>_>
               .super__Head_base<0UL,_const_Assimp::FBX::Object_*,_false>._M_head_impl;
      (this->object)._M_t.
      super___uniq_ptr_impl<const_Assimp::FBX::Object,_std::default_delete<const_Assimp::FBX::Object>_>
      ._M_t.
      super__Tuple_impl<0UL,_const_Assimp::FBX::Object_*,_std::default_delete<const_Assimp::FBX::Object>_>
      .super__Head_base<0UL,_const_Assimp::FBX::Object_*,_false>._M_head_impl = (Object *)this_02;
      if (pOVar1 != (Object *)0x0) {
        (*pOVar1->_vptr_Object[1])();
      }
    }
    iVar3 = strcmp(classtag._M_dataplus._M_p,"Line");
    if (iVar3 != 0) goto LAB_005177f2;
    this_00 = (Cluster *)operator_new(0x88);
    LineGeometry::LineGeometry((LineGeometry *)this_00,this->id,this->element,&name,this->doc);
  }
  else {
    iVar3 = strncmp(__s1,"NodeAttribute",__n);
    if (iVar3 == 0) {
      iVar3 = strcmp(classtag._M_dataplus._M_p,"Camera");
      if (iVar3 == 0) {
        this_00 = (Cluster *)operator_new(0x48);
        Camera::Camera((Camera *)this_00,this->id,this->element,this->doc,&name);
      }
      else {
        iVar3 = strcmp(classtag._M_dataplus._M_p,"CameraSwitcher");
        if (iVar3 == 0) {
          this_00 = (Cluster *)operator_new(0x90);
          CameraSwitcher::CameraSwitcher
                    ((CameraSwitcher *)this_00,this->id,this->element,this->doc,&name);
        }
        else {
          iVar3 = strcmp(classtag._M_dataplus._M_p,"Light");
          if (iVar3 == 0) {
            this_00 = (Cluster *)operator_new(0x48);
            Light::Light((Light *)this_00,this->id,this->element,this->doc,&name);
          }
          else {
            iVar3 = strcmp(classtag._M_dataplus._M_p,"Null");
            if (iVar3 == 0) {
              this_00 = (Cluster *)operator_new(0x48);
              Null::Null((Null *)this_00,this->id,this->element,this->doc,&name);
            }
            else {
              iVar3 = strcmp(classtag._M_dataplus._M_p,"LimbNode");
              if (iVar3 != 0) goto LAB_005177f2;
              this_00 = (Cluster *)operator_new(0x48);
              LimbNode::LimbNode((LimbNode *)this_00,this->id,this->element,this->doc,&name);
            }
          }
        }
      }
    }
    else {
      iVar3 = strncmp(__s1,"Deformer",__n);
      if (iVar3 == 0) {
        iVar3 = strcmp(classtag._M_dataplus._M_p,"Cluster");
        if (iVar3 == 0) {
          this_00 = (Cluster *)operator_new(0x100);
          Cluster::Cluster(this_00,this->id,this->element,this->doc,&name);
        }
        else {
          iVar3 = strcmp(classtag._M_dataplus._M_p,"Skin");
          if (iVar3 == 0) {
            this_00 = (Cluster *)operator_new(0x68);
            Skin::Skin((Skin *)this_00,this->id,this->element,this->doc,&name);
          }
          else {
            iVar3 = strcmp(classtag._M_dataplus._M_p,"BlendShape");
            if (iVar3 == 0) {
              this_00 = (Cluster *)operator_new(0x60);
              BlendShape::BlendShape((BlendShape *)this_00,this->id,this->element,this->doc,&name);
            }
            else {
              iVar3 = strcmp(classtag._M_dataplus._M_p,"BlendShapeChannel");
              if (iVar3 != 0) goto LAB_005177f2;
              this_00 = (Cluster *)operator_new(0x80);
              BlendShapeChannel::BlendShapeChannel
                        ((BlendShapeChannel *)this_00,this->id,this->element,this->doc,&name);
            }
          }
        }
      }
      else {
        iVar3 = strncmp(__s1,"Model",__n);
        if (iVar3 == 0) {
          iVar3 = strcmp(classtag._M_dataplus._M_p,"IKEffector");
          if ((iVar3 == 0) || (iVar3 = strcmp(classtag._M_dataplus._M_p,"FKEffector"), iVar3 == 0))
          goto LAB_005177f2;
          this_00 = (Cluster *)operator_new(0xd0);
          Model::Model((Model *)this_00,this->id,this->element,this->doc,&name);
        }
        else {
          iVar3 = strncmp(__s1,"Material",__n);
          if (iVar3 == 0) {
            this_00 = (Cluster *)operator_new(0xd0);
            FBX::Material::Material((Material *)this_00,this->id,this->element,this->doc,&name);
          }
          else {
            iVar3 = strncmp(__s1,"Texture",__n);
            if (iVar3 == 0) {
              this_00 = (Cluster *)operator_new(0xf0);
              Texture::Texture((Texture *)this_00,this->id,this->element,this->doc,&name);
            }
            else {
              iVar3 = strncmp(__s1,"LayeredTexture",__n);
              if (iVar3 == 0) {
                this_00 = (Cluster *)operator_new(0x58);
                LayeredTexture::LayeredTexture
                          ((LayeredTexture *)this_00,this->id,this->element,this->doc,&name);
              }
              else {
                iVar3 = strncmp(__s1,"Video",__n);
                if (iVar3 == 0) {
                  this_00 = (Cluster *)operator_new(0xb8);
                  Video::Video((Video *)this_00,this->id,this->element,this->doc,&name);
                }
                else {
                  iVar3 = strncmp(__s1,"AnimationStack",__n);
                  if (iVar3 == 0) {
                    this_00 = (Cluster *)operator_new(0x60);
                    AnimationStack::AnimationStack
                              ((AnimationStack *)this_00,this->id,this->element,&name,this->doc);
                  }
                  else {
                    iVar3 = strncmp(__s1,"AnimationLayer",__n);
                    if (iVar3 == 0) {
                      this_00 = (Cluster *)operator_new(0x50);
                      AnimationLayer::AnimationLayer
                                ((AnimationLayer *)this_00,this->id,this->element,&name,this->doc);
                    }
                    else {
                      iVar3 = strncmp(__s1,"AnimationCurve",__n);
                      if (iVar3 == 0) {
                        this_00 = (Cluster *)operator_new(0x98);
                        AnimationCurve::AnimationCurve
                                  ((AnimationCurve *)this_00,this->id,this->element,&name,this->doc)
                        ;
                      }
                      else {
                        iVar3 = strncmp(__s1,"AnimationCurveNode",__n);
                        if (iVar3 != 0) goto LAB_005177f2;
                        this_00 = (Cluster *)operator_new(0xa8);
                        AnimationCurveNode::AnimationCurveNode
                                  ((AnimationCurveNode *)this_00,this->id,this->element,&name,
                                   this->doc,(char **)0x0,0);
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  pOVar1 = (this->object)._M_t.
           super___uniq_ptr_impl<const_Assimp::FBX::Object,_std::default_delete<const_Assimp::FBX::Object>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_Assimp::FBX::Object_*,_std::default_delete<const_Assimp::FBX::Object>_>
           .super__Head_base<0UL,_const_Assimp::FBX::Object_*,_false>._M_head_impl;
  (this->object)._M_t.
  super___uniq_ptr_impl<const_Assimp::FBX::Object,_std::default_delete<const_Assimp::FBX::Object>_>.
  _M_t.
  super__Tuple_impl<0UL,_const_Assimp::FBX::Object_*,_std::default_delete<const_Assimp::FBX::Object>_>
  .super__Head_base<0UL,_const_Assimp::FBX::Object_*,_false>._M_head_impl = (Object *)this_00;
  if (pOVar1 != (Object *)0x0) {
    (*pOVar1->_vptr_Object[1])();
  }
LAB_005177f2:
  *(byte *)&this->flags = (byte)this->flags & 0xfe;
  pOVar1 = (this->object)._M_t.
           super___uniq_ptr_impl<const_Assimp::FBX::Object,_std::default_delete<const_Assimp::FBX::Object>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_Assimp::FBX::Object_*,_std::default_delete<const_Assimp::FBX::Object>_>
           .super__Head_base<0UL,_const_Assimp::FBX::Object_*,_false>._M_head_impl;
  std::__cxx11::string::~string((string *)&classtag);
  std::__cxx11::string::~string((string *)&name);
  return pOVar1;
}

Assistant:

const Object* LazyObject::Get(bool dieOnError)
{
    if(IsBeingConstructed() || FailedToConstruct()) {
        return nullptr;
    }

    if (object.get()) {
        return object.get();
    }

    const Token& key = element.KeyToken();
    const TokenList& tokens = element.Tokens();

    if(tokens.size() < 3) {
        DOMError("expected at least 3 tokens: id, name and class tag",&element);
    }

    const char* err;
    std::string name = ParseTokenAsString(*tokens[1],err);
    if (err) {
        DOMError(err,&element);
    }

    // small fix for binary reading: binary fbx files don't use
    // prefixes such as Model:: in front of their names. The
    // loading code expects this at many places, though!
    // so convert the binary representation (a 0x0001) to the
    // double colon notation.
    if(tokens[1]->IsBinary()) {
        for (size_t i = 0; i < name.length(); ++i) {
            if (name[i] == 0x0 && name[i+1] == 0x1) {
                name = name.substr(i+2) + "::" + name.substr(0,i);
            }
        }
    }

    const std::string classtag = ParseTokenAsString(*tokens[2],err);
    if (err) {
        DOMError(err,&element);
    }

    // prevent recursive calls
    flags |= BEING_CONSTRUCTED;

    try {
        // this needs to be relatively fast since it happens a lot,
        // so avoid constructing strings all the time.
        const char* obtype = key.begin();
        const size_t length = static_cast<size_t>(key.end()-key.begin());

        // For debugging
        //dumpObjectClassInfo( objtype, classtag );

        if (!strncmp(obtype,"Geometry",length)) {
            if (!strcmp(classtag.c_str(),"Mesh")) {
                object.reset(new MeshGeometry(id,element,name,doc));
            }
            if (!strcmp(classtag.c_str(), "Shape")) {
                object.reset(new ShapeGeometry(id, element, name, doc));
            }
            if (!strcmp(classtag.c_str(), "Line")) {
                object.reset(new LineGeometry(id, element, name, doc));
            }
        }
        else if (!strncmp(obtype,"NodeAttribute",length)) {
            if (!strcmp(classtag.c_str(),"Camera")) {
                object.reset(new Camera(id,element,doc,name));
            }
            else if (!strcmp(classtag.c_str(),"CameraSwitcher")) {
                object.reset(new CameraSwitcher(id,element,doc,name));
            }
            else if (!strcmp(classtag.c_str(),"Light")) {
                object.reset(new Light(id,element,doc,name));
            }
            else if (!strcmp(classtag.c_str(),"Null")) {
                object.reset(new Null(id,element,doc,name));
            }
            else if (!strcmp(classtag.c_str(),"LimbNode")) {
                object.reset(new LimbNode(id,element,doc,name));
            }
        }
        else if (!strncmp(obtype,"Deformer",length)) {
            if (!strcmp(classtag.c_str(),"Cluster")) {
                object.reset(new Cluster(id,element,doc,name));
            }
            else if (!strcmp(classtag.c_str(),"Skin")) {
                object.reset(new Skin(id,element,doc,name));
            }
            else if (!strcmp(classtag.c_str(), "BlendShape")) {
                object.reset(new BlendShape(id, element, doc, name));
            }
            else if (!strcmp(classtag.c_str(), "BlendShapeChannel")) {
                object.reset(new BlendShapeChannel(id, element, doc, name));
            }
        }
        else if ( !strncmp( obtype, "Model", length ) ) {
            // FK and IK effectors are not supported
            if ( strcmp( classtag.c_str(), "IKEffector" ) && strcmp( classtag.c_str(), "FKEffector" ) ) {
                object.reset( new Model( id, element, doc, name ) );
            }
        }
        else if (!strncmp(obtype,"Material",length)) {
            object.reset(new Material(id,element,doc,name));
        }
        else if (!strncmp(obtype,"Texture",length)) {
            object.reset(new Texture(id,element,doc,name));
        }
        else if (!strncmp(obtype,"LayeredTexture",length)) {
            object.reset(new LayeredTexture(id,element,doc,name));
        }
        else if (!strncmp(obtype,"Video",length)) {
            object.reset(new Video(id,element,doc,name));
        }
        else if (!strncmp(obtype,"AnimationStack",length)) {
            object.reset(new AnimationStack(id,element,name,doc));
        }
        else if (!strncmp(obtype,"AnimationLayer",length)) {
            object.reset(new AnimationLayer(id,element,name,doc));
        }
        // note: order matters for these two
        else if (!strncmp(obtype,"AnimationCurve",length)) {
            object.reset(new AnimationCurve(id,element,name,doc));
        }
        else if (!strncmp(obtype,"AnimationCurveNode",length)) {
            object.reset(new AnimationCurveNode(id,element,name,doc));
        }
    }
    catch(std::exception& ex) {
        flags &= ~BEING_CONSTRUCTED;
        flags |= FAILED_TO_CONSTRUCT;

        if(dieOnError || doc.Settings().strictMode) {
            throw;
        }

        // note: the error message is already formatted, so raw logging is ok
        if(!DefaultLogger::isNullLogger()) {
            ASSIMP_LOG_ERROR(ex.what());
        }
        return NULL;
    }

    if (!object.get()) {
        //DOMError("failed to convert element to DOM object, class: " + classtag + ", name: " + name,&element);
    }

    flags &= ~BEING_CONSTRUCTED;
    return object.get();
}